

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

void LZ4_resetStream_fast(LZ4_stream_t *ctx)

{
  uint uVar1;
  
  if ((ctx->internal_donotuse).dirty != 0) {
    memset(ctx,0,0x4020);
    return;
  }
  if ((ctx->internal_donotuse).tableType == 2) {
    uVar1 = (ctx->internal_donotuse).currentOffset;
    if (0x40000000 < uVar1) goto LAB_0010e5cc;
  }
  else {
    if ((ctx->internal_donotuse).tableType != 0) {
LAB_0010e5cc:
      (ctx->internal_donotuse).tableType = 0;
      memset(ctx,0,0x4004);
      goto LAB_0010e5f4;
    }
    uVar1 = (ctx->internal_donotuse).currentOffset;
  }
  if (uVar1 != 0) {
    (ctx->internal_donotuse).currentOffset = uVar1 + 0x10000;
  }
LAB_0010e5f4:
  ctx->table[0x801] = 0;
  ctx->table[0x802] = 0;
  (ctx->internal_donotuse).dictSize = 0;
  return;
}

Assistant:

void LZ4_resetStream_fast(LZ4_stream_t* ctx) {
    LZ4_prepareTable(&(ctx->internal_donotuse), 0, byU32);
}